

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  string *__lhs;
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  size_t i;
  ulong uVar6;
  size_t i_1;
  float fVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar10 [16];
  double dVar20;
  undefined1 auVar12 [16];
  undefined1 auVar15 [16];
  undefined1 auVar18 [16];
  undefined4 in_XMM2_Dc;
  undefined4 uVar21;
  undefined4 in_XMM2_Dd;
  undefined4 uVar22;
  double approxVal;
  double input;
  double local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  double local_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  TEvalOpts opts;
  undefined1 auVar11 [16];
  undefined1 auVar14 [16];
  undefined1 auVar17 [16];
  undefined1 auVar13 [16];
  undefined1 auVar16 [16];
  undefined1 auVar19 [16];
  
  ParseOptions(&opts,argc,argv);
  if (opts.NoDenormals == true) {
    local_8c = MXCSR;
    local_94 = MXCSR | 0x8000;
    MXCSR = MXCSR | 0x8040;
    local_98 = MXCSR;
    local_90 = local_94;
  }
  __lhs = &opts.Arch;
  bVar2 = std::operator==(__lhs,"plain");
  if (((bVar2) || (bVar2 = std::operator==(__lhs,"avx2"), bVar2)) ||
     (bVar2 = std::operator==(__lhs,"avx"), bVar2)) {
    bVar2 = std::operator==(&opts.Func,"exp");
    if (((bVar2) || (bVar2 = std::operator==(&opts.Func,"log"), bVar2)) ||
       ((bVar2 = std::operator==(&opts.Func,"sigm"), bVar2 ||
        (bVar2 = std::operator==(&opts.Func,"tanh"), bVar2)))) {
      bVar2 = std::operator==(__lhs,"avx2");
      bVar3 = std::operator==(__lhs,"avx");
      local_e8._0_4_ = opts.Lo;
      local_d8._0_4_ = opts.Hi;
      if (opts.Print == true) {
        poVar5 = std::operator<<((ostream *)&std::cout,"input\ttrue\tapprox");
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      bVar4 = std::operator==(&opts.Func,"exp");
      if (bVar4) {
        uVar21 = 0;
        uVar22 = 0;
        local_b0 = (double)(float)local_e8._0_4_;
        local_d8._0_4_ = (float)local_d8._0_4_ - (float)local_e8._0_4_;
        auVar10._8_4_ = (int)(opts.N >> 0x20);
        auVar10._0_8_ = opts.N;
        auVar10._12_4_ = 0x45300000;
        dVar20 = auVar10._8_8_ - 1.9342813113834067e+25;
        local_a8._8_4_ = SUB84(dVar20,0);
        local_a8._0_8_ = dVar20 + ((double)CONCAT44(0x43300000,(int)opts.N) - 4503599627370496.0);
        local_a8._12_4_ = (int)((ulong)dVar20 >> 0x20);
        local_f0 = 0.0;
        for (uVar6 = 0; opts.N + 1 != uVar6; uVar6 = uVar6 + 1) {
          dVar20 = (double)((float)uVar6 * (float)local_d8._0_4_) / (double)local_a8._0_8_ +
                   local_b0;
          if (opts.UseDouble == false) {
            input = (double)CONCAT44(input._4_4_,(float)dVar20);
            fVar7 = expf((float)dVar20);
            local_c8._0_4_ = fVar7;
            if (opts.Exact == true) {
              if (bVar2) {
                NFastOps::ExpAvx2<true,false>((float *)&input,1,(float *)&approxVal);
              }
              else if (bVar3) {
                NFastOps::ExpAvx<true,false>((float *)&input,1,(float *)&approxVal);
              }
              else {
LAB_0010a945:
                NFastOps::ExpPlain((float *)&input,1,(float *)&approxVal);
              }
            }
            else if (bVar2) {
              NFastOps::ExpAvx2<false,false>((float *)&input,1,(float *)&approxVal);
            }
            else {
              if (!bVar3) goto LAB_0010a945;
              NFastOps::ExpAvx<false,false>((float *)&input,1,(float *)&approxVal);
            }
            uVar1 = CONCAT44(uVar22,uVar21) & 0x7fffffffffffffff;
            uVar21 = (undefined4)uVar1;
            uVar22 = (undefined4)(uVar1 >> 0x20);
            local_e8._8_4_ = uVar21;
            local_e8._0_8_ =
                 ABS((double)approxVal._0_4_ - (double)(float)local_c8._0_4_) /
                 (ABS((double)(float)local_c8._0_4_) + 1e-100);
            local_e8._12_4_ = uVar22;
            if (opts.Print == true) {
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,input._0_4_);
              poVar5 = std::operator<<(poVar5,"\t");
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(float)local_c8._0_4_);
              poVar5 = std::operator<<(poVar5,"\t");
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,approxVal._0_4_);
              std::operator<<(poVar5,"\t");
              poVar5 = std::ostream::_M_insert<double>((double)local_e8._0_8_);
              std::endl<char,std::char_traits<char>>(poVar5);
            }
          }
          else {
            input = dVar20;
            dVar20 = exp(dVar20);
            local_c8._8_4_ = extraout_XMM0_Dc;
            local_c8._0_8_ = dVar20;
            local_c8._12_4_ = extraout_XMM0_Dd;
            if (opts.Exact == true) {
              if (bVar2) {
                NFastOps::ExpAvx2<true,false>(&input,1,&approxVal);
              }
              else if (bVar3) {
                NFastOps::ExpAvx<true,false>(&input,1,&approxVal);
              }
              else {
LAB_0010a874:
                NFastOps::ExpPlain(&input,1,&approxVal);
              }
            }
            else if (bVar2) {
              NFastOps::ExpAvx2<false,false>(&input,1,&approxVal);
            }
            else {
              if (!bVar3) goto LAB_0010a874;
              NFastOps::ExpAvx<false,false>(&input,1,&approxVal);
            }
            uVar21 = 0;
            uVar22 = 0;
            local_e8._8_8_ = 0;
            local_e8._0_8_ =
                 ABS((double)CONCAT44(approxVal._4_4_,approxVal._0_4_) - (double)local_c8._0_8_) /
                 (ABS((double)local_c8._0_8_) + 1e-100);
            if (opts.Print == true) {
              poVar5 = std::ostream::_M_insert<double>(input);
              std::operator<<(poVar5,"\t");
              poVar5 = std::ostream::_M_insert<double>((double)local_c8._0_8_);
              std::operator<<(poVar5,"\t");
              poVar5 = std::ostream::_M_insert<double>
                                 ((double)CONCAT44(approxVal._4_4_,approxVal._0_4_));
              std::operator<<(poVar5,"\t");
              poVar5 = std::ostream::_M_insert<double>((double)local_e8._0_8_);
              std::endl<char,std::char_traits<char>>(poVar5);
            }
          }
          uVar8 = local_e8._0_4_;
          uVar9 = local_e8._4_4_;
          if (local_e8._0_8_ <= local_f0) {
            uVar8 = SUB84(local_f0,0);
            uVar9 = (undefined4)((ulong)local_f0 >> 0x20);
          }
          local_f0 = (double)CONCAT44(uVar9,uVar8);
        }
      }
      else {
        local_a8._8_8_ = 0;
        local_a8._0_8_ = opts.N;
        bVar4 = std::operator==(&opts.Func,"log");
        local_c8._0_8_ = (double)(float)local_e8._0_4_;
        local_b0 = (double)CONCAT44(local_b0._4_4_,(float)local_d8._0_4_ - (float)local_e8._0_4_);
        if (bVar4) {
          auVar12._0_8_ = local_a8._0_8_;
          auVar12._12_4_ = local_a8._12_4_;
          auVar12._8_4_ = local_a8._4_4_;
          auVar11._8_8_ = auVar12._8_8_;
          auVar11._0_8_ = (double)CONCAT44(0x43300000,local_a8._0_4_);
          auVar13._0_12_ = auVar11._0_12_;
          auVar13._12_4_ = 0x45300000;
          dVar20 = auVar13._8_8_ - 1.9342813113834067e+25;
          local_a8._8_4_ = SUB84(dVar20,0);
          local_a8._0_8_ = dVar20 + (auVar11._0_8_ - 4503599627370496.0);
          local_a8._12_4_ = (int)((ulong)dVar20 >> 0x20);
          local_f0 = 0.0;
          for (uVar6 = 0; opts.N + 1 != uVar6; uVar6 = uVar6 + 1) {
            dVar20 = (double)((float)uVar6 * local_b0._0_4_) / (double)local_a8._0_8_ +
                     (double)local_c8._0_8_;
            if (opts.UseDouble == false) {
              fVar7 = expf((float)dVar20);
              input = (double)CONCAT44(input._4_4_,fVar7);
              fVar7 = logf(fVar7);
              local_d8._0_4_ = fVar7;
              if (opts.Exact == true) {
                if (bVar2) {
                  NFastOps::LogAvx2<true,false>((float *)&input,1,(float *)&approxVal);
                }
                else if (bVar3) {
                  NFastOps::LogAvx<true,false>((float *)&input,1,(float *)&approxVal);
                }
                else {
LAB_0010acbc:
                  NFastOps::LogPlain((float *)&input,1,(float *)&approxVal);
                }
              }
              else if (bVar2) {
                NFastOps::LogAvx2<false,false>((float *)&input,1,(float *)&approxVal);
              }
              else {
                if (!bVar3) goto LAB_0010acbc;
                NFastOps::LogAvx<false,false>((float *)&input,1,(float *)&approxVal);
              }
              uVar1 = CONCAT44(in_XMM2_Dd,in_XMM2_Dc) & 0x7fffffffffffffff;
              in_XMM2_Dc = (undefined4)uVar1;
              in_XMM2_Dd = (undefined4)(uVar1 >> 0x20);
              local_e8._8_4_ = in_XMM2_Dc;
              local_e8._0_8_ =
                   ABS((double)approxVal._0_4_ - (double)(float)local_d8._0_4_) /
                   (ABS((double)(float)local_d8._0_4_) + 1e-100);
              local_e8._12_4_ = in_XMM2_Dd;
              if (opts.Print == true) {
                poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,input._0_4_);
                poVar5 = std::operator<<(poVar5,"\t");
                poVar5 = (ostream *)
                         std::ostream::operator<<((ostream *)poVar5,(float)local_d8._0_4_);
                poVar5 = std::operator<<(poVar5,"\t");
                poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,approxVal._0_4_);
                std::operator<<(poVar5,"\t");
                poVar5 = std::ostream::_M_insert<double>((double)local_e8._0_8_);
                std::endl<char,std::char_traits<char>>(poVar5);
              }
            }
            else {
              input = exp(dVar20);
              dVar20 = log(input);
              local_d8._8_4_ = extraout_XMM0_Dc_00;
              local_d8._0_8_ = dVar20;
              local_d8._12_4_ = extraout_XMM0_Dd_00;
              if (opts.Exact == true) {
                if (bVar2) {
                  NFastOps::LogAvx2<true,false>(&input,1,&approxVal);
                }
                else if (bVar3) {
                  NFastOps::LogAvx<true,false>(&input,1,&approxVal);
                }
                else {
LAB_0010ac02:
                  NFastOps::LogPlain(&input,1,&approxVal);
                }
              }
              else if (bVar2) {
                NFastOps::LogAvx2<false,false>(&input,1,&approxVal);
              }
              else {
                if (!bVar3) goto LAB_0010ac02;
                NFastOps::LogAvx<false,false>(&input,1,&approxVal);
              }
              in_XMM2_Dc = 0;
              in_XMM2_Dd = 0;
              local_e8._8_8_ = 0;
              local_e8._0_8_ =
                   ABS((double)CONCAT44(approxVal._4_4_,approxVal._0_4_) - (double)local_d8._0_8_) /
                   (ABS((double)local_d8._0_8_) + 1e-100);
              if (opts.Print == true) {
                poVar5 = std::ostream::_M_insert<double>(input);
                std::operator<<(poVar5,"\t");
                poVar5 = std::ostream::_M_insert<double>((double)local_d8._0_8_);
                std::operator<<(poVar5,"\t");
                poVar5 = std::ostream::_M_insert<double>
                                   ((double)CONCAT44(approxVal._4_4_,approxVal._0_4_));
                std::operator<<(poVar5,"\t");
                poVar5 = std::ostream::_M_insert<double>((double)local_e8._0_8_);
                std::endl<char,std::char_traits<char>>(poVar5);
              }
            }
            uVar21 = local_e8._0_4_;
            uVar22 = local_e8._4_4_;
            if (local_e8._0_8_ <= local_f0) {
              uVar21 = SUB84(local_f0,0);
              uVar22 = (undefined4)((ulong)local_f0 >> 0x20);
            }
            local_f0 = (double)CONCAT44(uVar22,uVar21);
          }
        }
        else {
          bVar4 = std::operator==(&opts.Func,"sigm");
          local_c8._0_8_ = (double)(float)local_e8._0_4_;
          local_b0 = (double)CONCAT44(local_b0._4_4_,(float)local_d8._0_4_ - (float)local_e8._0_4_);
          if (bVar4) {
            auVar15._0_8_ = local_a8._0_8_;
            auVar15._12_4_ = local_a8._12_4_;
            auVar15._8_4_ = local_a8._4_4_;
            auVar14._8_8_ = auVar15._8_8_;
            auVar14._0_8_ = (double)CONCAT44(0x43300000,local_a8._0_4_);
            auVar16._0_12_ = auVar14._0_12_;
            auVar16._12_4_ = 0x45300000;
            dVar20 = auVar16._8_8_ - 1.9342813113834067e+25;
            local_a8._8_4_ = SUB84(dVar20,0);
            local_a8._0_8_ = dVar20 + (auVar14._0_8_ - 4503599627370496.0);
            local_a8._12_4_ = (int)((ulong)dVar20 >> 0x20);
            local_f0 = 0.0;
            for (uVar6 = 0; opts.N + 1 != uVar6; uVar6 = uVar6 + 1) {
              dVar20 = (double)((float)uVar6 * local_b0._0_4_) / (double)local_a8._0_8_ +
                       (double)local_c8._0_8_;
              if (opts.UseDouble == false) {
                input = (double)CONCAT44(input._4_4_,(float)dVar20);
                fVar7 = expf(-(float)dVar20);
                local_d8._0_4_ = 1.0 / (fVar7 + 1.0);
                if (opts.Exact == true) {
                  if (bVar2) {
                    NFastOps::SigmoidAvx2<true,false>((float *)&input,1,(float *)&approxVal);
                  }
                  else if (bVar3) {
                    NFastOps::SigmoidAvx<true,false>((float *)&input,1,(float *)&approxVal);
                  }
                  else {
LAB_0010b05d:
                    NFastOps::SigmoidPlain((float *)&input,1,(float *)&approxVal);
                  }
                }
                else if (bVar2) {
                  NFastOps::SigmoidAvx2<false,false>((float *)&input,1,(float *)&approxVal);
                }
                else {
                  if (!bVar3) goto LAB_0010b05d;
                  NFastOps::SigmoidAvx<false,false>((float *)&input,1,(float *)&approxVal);
                }
                uVar1 = CONCAT44(in_XMM2_Dd,in_XMM2_Dc) & 0x7fffffffffffffff;
                in_XMM2_Dc = (undefined4)uVar1;
                in_XMM2_Dd = (undefined4)(uVar1 >> 0x20);
                local_e8._8_4_ = in_XMM2_Dc;
                local_e8._0_8_ =
                     ABS((double)approxVal._0_4_ - (double)(float)local_d8._0_4_) /
                     (ABS((double)(float)local_d8._0_4_) + 1e-100);
                local_e8._12_4_ = in_XMM2_Dd;
                if (opts.Print == true) {
                  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,input._0_4_);
                  poVar5 = std::operator<<(poVar5,"\t");
                  poVar5 = (ostream *)
                           std::ostream::operator<<((ostream *)poVar5,(float)local_d8._0_4_);
                  poVar5 = std::operator<<(poVar5,"\t");
                  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,approxVal._0_4_);
                  std::operator<<(poVar5,"\t");
                  poVar5 = std::ostream::_M_insert<double>((double)local_e8._0_8_);
                  std::endl<char,std::char_traits<char>>(poVar5);
                }
              }
              else {
                input = dVar20;
                dVar20 = exp(-dVar20);
                local_d8._8_8_ = 0;
                local_d8._0_8_ = 1.0 / (dVar20 + 1.0);
                if (opts.Exact == true) {
                  if (bVar2) {
                    NFastOps::SigmoidAvx2<true,false>(&input,1,&approxVal);
                  }
                  else if (bVar3) {
                    NFastOps::SigmoidAvx<true,false>(&input,1,&approxVal);
                  }
                  else {
LAB_0010afa1:
                    NFastOps::SigmoidPlain(&input,1,&approxVal);
                  }
                }
                else if (bVar2) {
                  NFastOps::SigmoidAvx2<false,false>(&input,1,&approxVal);
                }
                else {
                  if (!bVar3) goto LAB_0010afa1;
                  NFastOps::SigmoidAvx<false,false>(&input,1,&approxVal);
                }
                in_XMM2_Dc = 0;
                in_XMM2_Dd = 0;
                local_e8._8_8_ = 0;
                local_e8._0_8_ =
                     ABS((double)CONCAT44(approxVal._4_4_,approxVal._0_4_) - (double)local_d8._0_8_)
                     / (ABS((double)local_d8._0_8_) + 1e-100);
                if (opts.Print == true) {
                  poVar5 = std::ostream::_M_insert<double>(input);
                  std::operator<<(poVar5,"\t");
                  poVar5 = std::ostream::_M_insert<double>((double)local_d8._0_8_);
                  std::operator<<(poVar5,"\t");
                  poVar5 = std::ostream::_M_insert<double>
                                     ((double)CONCAT44(approxVal._4_4_,approxVal._0_4_));
                  std::operator<<(poVar5,"\t");
                  poVar5 = std::ostream::_M_insert<double>((double)local_e8._0_8_);
                  std::endl<char,std::char_traits<char>>(poVar5);
                }
              }
              uVar21 = local_e8._0_4_;
              uVar22 = local_e8._4_4_;
              if (local_e8._0_8_ <= local_f0) {
                uVar21 = SUB84(local_f0,0);
                uVar22 = (undefined4)((ulong)local_f0 >> 0x20);
              }
              local_f0 = (double)CONCAT44(uVar22,uVar21);
            }
          }
          else {
            bVar4 = std::operator==(&opts.Func,"tanh");
            local_f0 = 0.0;
            if (bVar4) {
              local_b0 = (double)(float)local_e8._0_4_;
              local_d8._0_4_ = (float)local_d8._0_4_ - (float)local_e8._0_4_;
              auVar18._0_8_ = local_a8._0_8_;
              auVar18._12_4_ = local_a8._12_4_;
              auVar18._8_4_ = local_a8._4_4_;
              auVar17._8_8_ = auVar18._8_8_;
              auVar17._0_8_ = (double)CONCAT44(0x43300000,local_a8._0_4_);
              auVar19._0_12_ = auVar17._0_12_;
              auVar19._12_4_ = 0x45300000;
              dVar20 = auVar19._8_8_ - 1.9342813113834067e+25;
              local_a8._8_4_ = SUB84(dVar20,0);
              local_a8._0_8_ = dVar20 + (auVar17._0_8_ - 4503599627370496.0);
              local_a8._12_4_ = (int)((ulong)dVar20 >> 0x20);
              local_f0 = 0.0;
              for (uVar6 = 0; opts.N + 1 != uVar6; uVar6 = uVar6 + 1) {
                dVar20 = (double)((float)uVar6 * (float)local_d8._0_4_) / (double)local_a8._0_8_ +
                         local_b0;
                if (opts.UseDouble == false) {
                  input = (double)CONCAT44(input._4_4_,(float)dVar20);
                  fVar7 = tanhf((float)dVar20);
                  local_c8._0_4_ = fVar7;
                  if (opts.Exact == true) {
                    if (bVar2) {
                      NFastOps::TanhAvx2<true,false>((float *)&input,1,(float *)&approxVal);
                    }
                    else if (bVar3) {
                      NFastOps::TanhAvx<true,false>((float *)&input,1,(float *)&approxVal);
                    }
                    else {
LAB_0010b3cb:
                      NFastOps::TanhPlain((float *)&input,1,(float *)&approxVal);
                    }
                  }
                  else if (bVar2) {
                    NFastOps::TanhAvx2<false,false>((float *)&input,1,(float *)&approxVal);
                  }
                  else {
                    if (!bVar3) goto LAB_0010b3cb;
                    NFastOps::TanhAvx<false,false>((float *)&input,1,(float *)&approxVal);
                  }
                  uVar1 = CONCAT44(in_XMM2_Dd,in_XMM2_Dc) & 0x7fffffffffffffff;
                  in_XMM2_Dc = (undefined4)uVar1;
                  in_XMM2_Dd = (undefined4)(uVar1 >> 0x20);
                  local_e8._8_4_ = in_XMM2_Dc;
                  local_e8._0_8_ =
                       ABS((double)approxVal._0_4_ - (double)(float)local_c8._0_4_) /
                       (ABS((double)(float)local_c8._0_4_) + 1e-100);
                  local_e8._12_4_ = in_XMM2_Dd;
                  if (opts.Print == true) {
                    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,input._0_4_);
                    poVar5 = std::operator<<(poVar5,"\t");
                    poVar5 = (ostream *)
                             std::ostream::operator<<((ostream *)poVar5,(float)local_c8._0_4_);
                    poVar5 = std::operator<<(poVar5,"\t");
                    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,approxVal._0_4_);
                    std::operator<<(poVar5,"\t");
                    poVar5 = std::ostream::_M_insert<double>((double)local_e8._0_8_);
                    std::endl<char,std::char_traits<char>>(poVar5);
                  }
                }
                else {
                  input = dVar20;
                  dVar20 = tanh(dVar20);
                  local_c8._8_4_ = extraout_XMM0_Dc_01;
                  local_c8._0_8_ = dVar20;
                  local_c8._12_4_ = extraout_XMM0_Dd_01;
                  if (opts.Exact == true) {
                    if (bVar2) {
                      NFastOps::TanhAvx2<true,false>(&input,1,&approxVal);
                    }
                    else if (bVar3) {
                      NFastOps::TanhAvx<true,false>(&input,1,&approxVal);
                    }
                    else {
LAB_0010b311:
                      NFastOps::TanhPlain(&input,1,&approxVal);
                    }
                  }
                  else if (bVar2) {
                    NFastOps::TanhAvx2<false,false>(&input,1,&approxVal);
                  }
                  else {
                    if (!bVar3) goto LAB_0010b311;
                    NFastOps::TanhAvx<false,false>(&input,1,&approxVal);
                  }
                  in_XMM2_Dc = 0;
                  in_XMM2_Dd = 0;
                  local_e8._8_8_ = 0;
                  local_e8._0_8_ =
                       ABS((double)CONCAT44(approxVal._4_4_,approxVal._0_4_) -
                           (double)local_c8._0_8_) / (ABS((double)local_c8._0_8_) + 1e-100);
                  if (opts.Print == true) {
                    poVar5 = std::ostream::_M_insert<double>(input);
                    std::operator<<(poVar5,"\t");
                    poVar5 = std::ostream::_M_insert<double>((double)local_c8._0_8_);
                    std::operator<<(poVar5,"\t");
                    poVar5 = std::ostream::_M_insert<double>
                                       ((double)CONCAT44(approxVal._4_4_,approxVal._0_4_));
                    std::operator<<(poVar5,"\t");
                    poVar5 = std::ostream::_M_insert<double>((double)local_e8._0_8_);
                    std::endl<char,std::char_traits<char>>(poVar5);
                  }
                }
                uVar21 = local_e8._0_4_;
                uVar22 = local_e8._4_4_;
                if (local_e8._0_8_ <= local_f0) {
                  uVar21 = SUB84(local_f0,0);
                  uVar22 = (undefined4)((ulong)local_f0 >> 0x20);
                }
                local_f0 = (double)CONCAT44(uVar22,uVar21);
              }
            }
          }
        }
      }
      std::operator<<((ostream *)&std::cout,"Maximum relative error: ");
      poVar5 = std::ostream::_M_insert<double>(local_f0);
      std::endl<char,std::char_traits<char>>(poVar5);
      TEvalOpts::~TEvalOpts(&opts);
      return 0;
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "requirement func == \"exp\" || func == \"log\" || func == \"sigm\" || func == \"tanh\" failed"
                            );
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "requirement arch == \"plain\" || arch == \"avx2\" || arch == \"avx\" failed"
                            );
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
    TEvalOpts opts = ParseOptions(argc, argv);

    if (opts.NoDenormals) {
        _MM_SET_FLUSH_ZERO_MODE(_MM_FLUSH_ZERO_ON);
        _MM_SET_DENORMALS_ZERO_MODE(_MM_DENORMALS_ZERO_ON);
    }

    if (!(opts.Arch == "plain" || opts.Arch == "avx2" || opts.Arch == "avx")) {
        std::cerr << "requirement arch == \"plain\" || arch == \"avx2\" || arch == \"avx\" failed" << std::endl;
        exit(1);
    }
    if (!(opts.Func == "exp" || opts.Func == "log" || opts.Func == "sigm" || opts.Func == "tanh")) {
        std::cerr << "requirement func == \"exp\" || func == \"log\" || func == \"sigm\" || func == \"tanh\" failed" << std::endl;
        exit(1);
    }

    bool isAvx2 = opts.Arch == "avx2";
    bool isAvx = opts.Arch == "avx";
    float lo = opts.Lo;
    float hi = opts.Hi;
    size_t n = opts.N;

    if (opts.Print) {
        std::cout << "input\ttrue\tapprox" << std::endl;
    }

    double maxError = 0;
    if (opts.Func == "exp") {
        for (size_t i = 0; i < n + 1; ++i) {
            double error = 0;
            if (!opts.UseDouble) {
                float input = lo + (hi - lo) * i * 1.0 / n;
                float trueVal = exp(input);
                float approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::ExpAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::ExpAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::ExpPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::ExpAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::ExpAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::ExpPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            } else {
                double input = lo + (hi - lo) * i * 1.0 / n;
                double trueVal = exp(input);
                double approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::ExpAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::ExpAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::ExpPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::ExpAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::ExpAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::ExpPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            }
            if (error > maxError) {
                maxError = error;
            }
        }
    } else if (opts.Func == "log") {
        for (size_t i = 0; i < n + 1; ++i) {
            double error = 0;
            if (!opts.UseDouble) {
                float input = lo + (hi - lo) * i * 1.0 / n;
                input = exp(input);
                float trueVal = log(input);
                float approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::LogAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::LogAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::LogPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::LogAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::LogAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::LogPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            } else {
                double input = lo + (hi - lo) * i * 1.0 / n;
                input = exp(input);
                double trueVal = log(input);
                double approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::LogAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::LogAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::LogPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::LogAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::LogAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::LogPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            }
            if (error > maxError) {
                maxError = error;
            }
        }
    } else if (opts.Func == "sigm") {
        for (size_t i = 0; i < n + 1; ++i) {
            double error = 0;
            if (!opts.UseDouble) {
                float input = lo + (hi - lo) * i * 1.0 / n;
                float trueVal = 1.0 / (1.0 + exp(-input));
                float approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::SigmoidAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::SigmoidAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::SigmoidPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::SigmoidAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::SigmoidAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::SigmoidPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            } else {
                double input = lo + (hi - lo) * i * 1.0 / n;
                double trueVal = 1.0 / (1.0 + exp(-input));
                double approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::SigmoidAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::SigmoidAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::SigmoidPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::SigmoidAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::SigmoidAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::SigmoidPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            }
            if (error > maxError) {
                maxError = error;
            }
        }
    } else if (opts.Func == "tanh") {
        for (size_t i = 0; i < n + 1; ++i) {
            double error = 0;
            if (!opts.UseDouble) {
                float input = lo + (hi - lo) * i * 1.0 / n;
                float trueVal = tanh(input);
                float approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::TanhAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::TanhAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::TanhPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::TanhAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::TanhAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::TanhPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            } else {
                double input = lo + (hi - lo) * i * 1.0 / n;
                double trueVal = tanh(input);
                double approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::TanhAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::TanhAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::TanhPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::TanhAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::TanhAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::TanhPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            }
            if (error > maxError) {
                maxError = error;
            }
        }
    }
    std::cout << "Maximum relative error: " << maxError << std::endl;
}